

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void AnalyzeImplicitModuleImports(ExpressionContext *ctx)

{
  SmallArray<ModuleData_*,_128U> *this;
  SmallArray<ModuleData_*,_128U> *this_00;
  ByteCode *pBVar1;
  ModuleData *pMVar2;
  int iVar3;
  ModuleData **ppMVar4;
  uint i;
  uint uVar5;
  uint k;
  uint uVar6;
  TraceScope traceScope;
  TraceScope traceScope_1;
  TraceScope local_50;
  TraceScope local_40;
  
  if ((AnalyzeImplicitModuleImports(ExpressionContext&)::token == '\0') &&
     (iVar3 = __cxa_guard_acquire(&AnalyzeImplicitModuleImports(ExpressionContext&)::token),
     iVar3 != 0)) {
    AnalyzeImplicitModuleImports::token =
         NULLC::TraceGetToken("analyze","AnalyzeImplicitModuleImports");
    __cxa_guard_release(&AnalyzeImplicitModuleImports(ExpressionContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&local_50,AnalyzeImplicitModuleImports::token);
  this = &ctx->uniqueDependencies;
  this_00 = &ctx->implicitImports;
  uVar5 = 0;
LAB_00179e2b:
  if ((ctx->uniqueDependencies).count <= uVar5) {
    for (uVar5 = 0; uVar5 < (ctx->implicitImports).count; uVar5 = uVar5 + 1) {
      ppMVar4 = SmallArray<ModuleData_*,_128U>::operator[](this_00,uVar5);
      pMVar2 = *ppMVar4;
      if ((AnalyzeImplicitModuleImports(ExpressionContext&)::token == '\0') &&
         (iVar3 = __cxa_guard_acquire(&AnalyzeImplicitModuleImports(ExpressionContext&)::token),
         iVar3 != 0)) {
        AnalyzeImplicitModuleImports(ExpressionContext&)::token =
             NULLC::TraceGetToken("analyze","AnalyzeImplicitModuleImport");
        __cxa_guard_release(&AnalyzeImplicitModuleImports(ExpressionContext&)::token);
      }
      NULLC::TraceScope::TraceScope
                (&local_40,AnalyzeImplicitModuleImports(ExpressionContext&)::token);
      NULLC::TraceLabel((pMVar2->name).begin,(pMVar2->name).end);
      ImportModule(ctx,pMVar2->source,pMVar2->bytecode,pMVar2->lexStream,pMVar2->lexStreamSize,
                   pMVar2->name);
      NULLC::TraceScope::~TraceScope(&local_40);
    }
    NULLC::TraceScope::~TraceScope(&local_50);
    return;
  }
  uVar6 = 0;
  do {
    if ((ctx->imports).count <= uVar6) {
      uVar6 = 0;
      goto LAB_00179e6d;
    }
    ppMVar4 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->imports,uVar6);
    pBVar1 = (*ppMVar4)->bytecode;
    ppMVar4 = SmallArray<ModuleData_*,_128U>::operator[](this,uVar5);
    uVar6 = uVar6 + 1;
  } while (pBVar1 != (*ppMVar4)->bytecode);
  goto LAB_00179eb9;
  while( true ) {
    ppMVar4 = SmallArray<ModuleData_*,_128U>::operator[](this_00,uVar6);
    pBVar1 = (*ppMVar4)->bytecode;
    ppMVar4 = SmallArray<ModuleData_*,_128U>::operator[](this,uVar5);
    uVar6 = uVar6 + 1;
    if (pBVar1 == (*ppMVar4)->bytecode) break;
LAB_00179e6d:
    if ((ctx->implicitImports).count <= uVar6) {
      ppMVar4 = SmallArray<ModuleData_*,_128U>::operator[](this,uVar5);
      SmallArray<ModuleData_*,_128U>::push_back(this_00,ppMVar4);
      break;
    }
  }
LAB_00179eb9:
  uVar5 = uVar5 + 1;
  goto LAB_00179e2b;
}

Assistant:

void AnalyzeImplicitModuleImports(ExpressionContext &ctx)
{
	TRACE_SCOPE("analyze", "AnalyzeImplicitModuleImports");

	// Find which transitive dependencies haven't been imported explicitly
	for(unsigned i = 0; i < ctx.uniqueDependencies.size(); i++)
	{
		bool hasImport = false;

		for(unsigned k = 0; k < ctx.imports.size(); k++)
		{
			if(ctx.imports[k]->bytecode == ctx.uniqueDependencies[i]->bytecode)
			{
				hasImport = true;
				break;
			}
		}

		if(hasImport)
			continue;

		bool hasImplicitImport = false;

		for(unsigned k = 0; k < ctx.implicitImports.size(); k++)
		{
			if(ctx.implicitImports[k]->bytecode == ctx.uniqueDependencies[i]->bytecode)
			{
				hasImplicitImport = true;
				break;
			}
		}

		if(hasImplicitImport)
			continue;

		ctx.implicitImports.push_back(ctx.uniqueDependencies[i]);
	}

	// Import additional modules
	for(unsigned i = 0; i < ctx.implicitImports.size(); i++)
	{
		ModuleData *moduleData = ctx.implicitImports[i];

		TRACE_SCOPE("analyze", "AnalyzeImplicitModuleImport");
		TRACE_LABEL2(moduleData->name.begin, moduleData->name.end);

		ImportModule(ctx, moduleData->source, moduleData->bytecode, moduleData->lexStream, moduleData->lexStreamSize, moduleData->name);
	}
}